

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_cgraph * ggml_graph_view(ggml_cgraph *cgraph0,int i0,int i1)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  ggml_cgraph *in_RDI;
  ggml_cgraph *cgraph;
  
  memset(in_RDI,0,0x50);
  in_RDI->n_nodes = in_ECX - in_EDX;
  in_RDI->nodes = (ggml_tensor **)(*(long *)(in_RSI + 0x10) + (long)in_EDX * 8);
  in_RDI->order = *(ggml_cgraph_eval_order *)(in_RSI + 0x48);
  return in_RDI;
}

Assistant:

struct ggml_cgraph ggml_graph_view(struct ggml_cgraph * cgraph0, int i0, int i1) {
    struct ggml_cgraph cgraph = {
        /*.size             =*/ 0,
        /*.n_nodes          =*/ i1 - i0,
        /*.n_leafs          =*/ 0,
        /*.nodes            =*/ cgraph0->nodes + i0,
        /*.grads            =*/ NULL, // gradients would need visited_hash_set
        /*.grad_accs        =*/ NULL,
        /*.leafs            =*/ NULL,
        /*.visited_hash_set =*/ { 0, NULL, NULL },
        /*.order            =*/ cgraph0->order,
    };

    return cgraph;
}